

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfFormatter<char>::parse_flags
          (PrintfFormatter<char> *this,FormatSpec *spec,char **s)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar3 = spec->flags_;
  pcVar4 = *s;
  do {
    while( true ) {
      while( true ) {
        pcVar1 = pcVar4 + 1;
        *s = pcVar1;
        cVar2 = *pcVar4;
        if (cVar2 != '-') break;
        (spec->super_AlignSpec).align_ = ALIGN_LEFT;
        pcVar4 = pcVar1;
      }
      if (cVar2 != '0') break;
      (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
      pcVar4 = pcVar1;
    }
    if (cVar2 == ' ') {
      uVar3 = uVar3 | 1;
    }
    else if (cVar2 == '#') {
      uVar3 = uVar3 | 8;
    }
    else {
      if (cVar2 != '+') {
        *s = pcVar4;
        return;
      }
      uVar3 = uVar3 | 3;
    }
    spec->flags_ = uVar3;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::parse_flags(
    FormatSpec &spec, const Char *&s) {
  for (;;) {
    switch (*s++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags_ |= SIGN_FLAG;
        break;
      case '#':
        spec.flags_ |= HASH_FLAG;
        break;
      default:
        --s;
        return;
    }
  }
}